

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O2

int nc_match_single(GENERAL_NAME *gen,GENERAL_NAME *base)

{
  uint uVar1;
  uint uVar2;
  X509_NAME *a;
  X509_NAME *a_00;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  CBS *cbs;
  CBS *pCVar6;
  uint8_t byte;
  CBS base_cbs;
  CBS eml_cbs;
  CBS local_38;
  CBS eml_local;
  
  iVar4 = 0x33;
  switch(base->type) {
  case 1:
    eml_cbs.data = ((gen->d).rfc822Name)->data;
    eml_cbs.len = (size_t)((gen->d).rfc822Name)->length;
    base_cbs.data = ((base->d).rfc822Name)->data;
    base_cbs.len = (size_t)((base->d).rfc822Name)->length;
    iVar4 = CBS_get_until_first(&eml_cbs,&eml_local,'@');
    if (iVar4 == 0) {
      return 0x35;
    }
    iVar4 = CBS_get_until_first(&base_cbs,&local_38,'@');
    if (iVar4 == 0) {
      if ((base_cbs.len != 0) && (*base_cbs.data == '.')) goto LAB_00412c8d;
    }
    else {
      if ((local_38.len != 0) &&
         (iVar4 = CBS_mem_equal(&local_38,
                                (uint8_t *)CONCAT71(eml_local.data._1_7_,(char)eml_local.data),
                                eml_local.len), iVar4 == 0)) {
        return 0x2f;
      }
      if ((base_cbs.len == 0) || (*base_cbs.data != '@')) {
        __assert_fail("starts_with(&base_cbs, \'@\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                      ,0x1ca,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
      }
      CBS_skip(&base_cbs,1);
    }
    if ((eml_cbs.len == 0) || (*eml_cbs.data != '@')) {
      __assert_fail("starts_with(&eml_cbs, \'@\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                    ,0x1cf,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
    }
    cbs = &eml_cbs;
    CBS_skip(cbs,1);
    pCVar6 = &base_cbs;
    break;
  case 2:
    eml_cbs.data = ((gen->d).rfc822Name)->data;
    uVar1 = ((gen->d).rfc822Name)->length;
    eml_cbs.len = (size_t)(int)uVar1;
    base_cbs.data = ((base->d).rfc822Name)->data;
    uVar2 = ((base->d).rfc822Name)->length;
    base_cbs.len = (size_t)(int)uVar2;
    if (base_cbs.len == 0) {
      return 0;
    }
    if (*base_cbs.data != '.') {
      if (uVar2 < uVar1) {
        iVar4 = CBS_skip(&eml_cbs,~base_cbs.len + eml_cbs.len);
        if (iVar4 == 0) {
          return 0x2f;
        }
        iVar4 = CBS_get_u8(&eml_cbs,(uint8_t *)&eml_local);
        if (iVar4 == 0) {
          return 0x2f;
        }
        if ((char)eml_local.data != '.') {
          return 0x2f;
        }
      }
      pCVar6 = &eml_cbs;
      cbs = &base_cbs;
      break;
    }
LAB_00412c8d:
    pCVar6 = &eml_cbs;
LAB_00412c92:
    iVar5 = has_suffix_case(pCVar6,&base_cbs);
    goto LAB_00412e2a;
  default:
    goto switchD_00412b34_caseD_3;
  case 4:
    a = (gen->d).directoryName;
    a_00 = (base->d).directoryName;
    if ((a->modified != 0) && (iVar4 = i2d_X509_NAME((X509_NAME *)a,(uchar **)0x0), iVar4 < 0)) {
      return 0x11;
    }
    if ((a_00->modified != 0) && (iVar4 = i2d_X509_NAME((X509_NAME *)a_00,(uchar **)0x0), iVar4 < 0)
       ) {
      return 0x11;
    }
    iVar4 = a_00->canon_enclen;
    if (a->canon_enclen < iVar4) {
      return 0x2f;
    }
    if ((iVar4 != 0) && (iVar4 = bcmp(a_00->canon_enc,a->canon_enc,(long)iVar4), iVar4 != 0)) {
      return 0x2f;
    }
    return 0;
  case 6:
    eml_cbs.data = ((gen->d).rfc822Name)->data;
    eml_cbs.len = (size_t)((gen->d).rfc822Name)->length;
    puVar3 = ((base->d).rfc822Name)->data;
    iVar4 = ((base->d).rfc822Name)->length;
    base_cbs.len = (size_t)iVar4;
    base_cbs.data = puVar3;
    iVar5 = CBS_get_until_first(&eml_cbs,&eml_local,':');
    if (iVar5 == 0) {
      return 0x35;
    }
    iVar5 = CBS_skip(&eml_cbs,1);
    if (iVar5 == 0) {
      return 0x35;
    }
    iVar5 = CBS_get_u8(&eml_cbs,&byte);
    if (iVar5 == 0) {
      return 0x35;
    }
    if (byte != '/') {
      return 0x35;
    }
    iVar5 = CBS_get_u8(&eml_cbs,&byte);
    if (iVar5 == 0) {
      return 0x35;
    }
    if (byte != '/') {
      return 0x35;
    }
    iVar5 = CBS_get_until_first(&eml_cbs,&local_38,':');
    if ((iVar5 == 0) && (iVar5 = CBS_get_until_first(&eml_cbs,&local_38,'/'), iVar5 == 0)) {
      local_38.data = eml_cbs.data;
      local_38.len = eml_cbs.len;
    }
    if (local_38.len == 0) {
      return 0x35;
    }
    if ((iVar4 != 0) && (*puVar3 == '.')) {
      pCVar6 = &local_38;
      goto LAB_00412c92;
    }
    pCVar6 = &base_cbs;
    cbs = &local_38;
  }
  iVar5 = equal_case(pCVar6,cbs);
LAB_00412e2a:
  iVar4 = 0x2f;
  if (iVar5 != 0) {
    iVar4 = 0;
  }
switchD_00412b34_caseD_3:
  return iVar4;
}

Assistant:

static int nc_match_single(GENERAL_NAME *gen, GENERAL_NAME *base) {
  switch (base->type) {
    case GEN_DIRNAME:
      return nc_dn(gen->d.directoryName, base->d.directoryName);

    case GEN_DNS:
      return nc_dns(gen->d.dNSName, base->d.dNSName);

    case GEN_EMAIL:
      return nc_email(gen->d.rfc822Name, base->d.rfc822Name);

    case GEN_URI:
      return nc_uri(gen->d.uniformResourceIdentifier,
                    base->d.uniformResourceIdentifier);

    default:
      return X509_V_ERR_UNSUPPORTED_CONSTRAINT_TYPE;
  }
}